

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::focusOutEvent(QGraphicsScene *this,QFocusEvent *focusEvent)

{
  QGraphicsScenePrivate *this_00;
  FocusReason focusReason;
  
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  *(uint *)&this_00->field_0xb8 = *(uint *)&this_00->field_0xb8 & 0xfffffbff;
  this_00->passiveFocusItem = this_00->focusItem;
  focusReason = QFocusEvent::reason();
  setFocusItem(this,(QGraphicsItem *)0x0,focusReason);
  if ((this_00->popupWidgets).d.size != 0) {
    QGraphicsScenePrivate::removePopup(this_00,*(this_00->popupWidgets).d.ptr,false);
    return;
  }
  return;
}

Assistant:

void QGraphicsScene::focusOutEvent(QFocusEvent *focusEvent)
{
    Q_D(QGraphicsScene);
    d->hasFocus = false;
    d->passiveFocusItem = d->focusItem;
    setFocusItem(nullptr, focusEvent->reason());

    // Remove all popups when the scene loses focus.
    if (!d->popupWidgets.isEmpty())
        d->removePopup(d->popupWidgets.constFirst());
}